

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

int __thiscall CmdLineArgsParser::Parse(CmdLineArgsParser *this,LPWSTR oneArg)

{
  code *pcVar1;
  bool bVar2;
  char16 cVar3;
  int iVar4;
  char16 *pcVar5;
  Exception *this_00;
  LPWSTR psz;
  undefined8 *in_FS_OFFSET;
  Exception *exp;
  WCHAR local_428 [4];
  char16 buffer [512];
  int err;
  LPWSTR oneArg_local;
  CmdLineArgsParser *this_local;
  
  buffer[0x1fe] = L'\0';
  buffer[0x1ff] = L'\0';
  memset(local_428,0,0x400);
  this->pszCurrentArg = oneArg;
  if (this->pszCurrentArg == (LPWSTR)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                       ,0x288,"(0 != this->pszCurrentArg)","How can command line give NULL argv\'s")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  cVar3 = CurChar(this);
  if (cVar3 == L'-') {
    cVar3 = PeekChar(this);
    if (cVar3 == L'-') {
      NextChar(this);
    }
    NextChar(this);
    cVar3 = CurChar(this);
    if (cVar3 == L'?') {
      PrintUsage(this);
      return -1;
    }
    ParseFlag(this);
  }
  else {
    pcVar5 = Js::String::operator_cast_to_char16_t_(&this->flagTable->Filename);
    if (pcVar5 != (char16 *)0x0) {
      this_00 = (Exception *)__cxa_allocate_exception(8);
      Exception::Exception(this_00,L"Duplicate filename entry");
      __cxa_throw(this_00,&Exception::typeinfo,0);
    }
    psz = ParseString(this,local_428,0x200,false);
    Js::String::operator=(&this->flagTable->Filename,psz);
  }
  iVar4._0_2_ = buffer[0x1fe];
  iVar4._2_2_ = buffer[0x1ff];
  return iVar4;
}

Assistant:

int CmdLineArgsParser::Parse(__in LPWSTR oneArg) throw()
{
    int err = 0;
    char16 buffer[MaxTokenSize];
    ZeroMemory(buffer, sizeof(buffer));

    this->pszCurrentArg = oneArg;
    AssertMsg(NULL != this->pszCurrentArg, "How can command line give NULL argv's");
    try
    {
        switch(CurChar())
        {
        case '-' :
            if ('-' == PeekChar())
            {
                //support --
                NextChar();
            }
            //fallthrough
#ifdef _WIN32
        // Only support '/' as a command line switch start char on Windows
        // for legacy reason. Deprecate on xplat, as it starts a path on Unix.
        case '/':
#endif
            NextChar();
            if('?' == CurChar())
            {
                PrintUsage();
                return -1;
            }
            ParseFlag();
            break;
        default:
            if(NULL != this->flagTable.Filename)
            {
                throw Exception(_u("Duplicate filename entry"));
            }

            this->flagTable.Filename = ParseString(buffer, MaxTokenSize, false);
            break;
        }
    }
    catch(Exception &exp)
    {
        Output::Print(_u("%s : %s\n"), (LPCWSTR)exp, oneArg);
        err = -1;
    }
    return err;
}